

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok.c
# Opt level: O1

XML_Convert_Result
utf8_toUtf16(ENCODING *enc,char **fromP,char *fromLim,unsigned_short **toP,unsigned_short *toLim)

{
  byte bVar1;
  char cVar2;
  XML_Convert_Result XVar3;
  unsigned_short *puVar4;
  byte *pbVar5;
  ushort uVar6;
  int iVar7;
  bool bVar8;
  
  puVar4 = *toP;
  pbVar5 = (byte *)*fromP;
  bVar8 = pbVar5 < fromLim;
  XVar3 = XML_CONVERT_COMPLETED;
  if (puVar4 < toLim && bVar8) {
    XVar3 = XML_CONVERT_COMPLETED;
    do {
      bVar1 = *pbVar5;
      uVar6 = (ushort)bVar1;
      cVar2 = *(char *)((long)enc[1].scanners + (ulong)uVar6);
      if (cVar2 == '\a') {
        iVar7 = 5;
        if ((long)toLim - (long)puVar4 < 3) {
          XVar3 = XML_CONVERT_OUTPUT_EXHAUSTED;
        }
        else if ((long)fromLim - (long)pbVar5 < 4) {
          XVar3 = XML_CONVERT_INPUT_INCOMPLETE;
        }
        else {
          iVar7 = (pbVar5[2] & 0x3f) * 0x40;
          bVar1 = pbVar5[3];
          *puVar4 = (ushort)(((pbVar5[1] & 0x3f) << 0xc | (uVar6 & 7) << 0x12) + iVar7 + 0xff0000 >>
                            10) | 0xd800;
          puVar4[1] = bVar1 & 0x3f | (ushort)iVar7 | 0xdc00;
          puVar4 = puVar4 + 2;
          pbVar5 = pbVar5 + 4;
          iVar7 = 0;
        }
        if (iVar7 != 0) {
          if (iVar7 != 5) {
            return XVar3;
          }
          goto LAB_00463690;
        }
      }
      else if (cVar2 == '\x06') {
        if ((long)fromLim - (long)pbVar5 < 3) {
LAB_0046369b:
          XVar3 = XML_CONVERT_INPUT_INCOMPLETE;
          goto LAB_00463690;
        }
        *puVar4 = pbVar5[2] & 0x3f | (pbVar5[1] & 0x3f) << 6 | uVar6 << 0xc;
        puVar4 = puVar4 + 1;
        pbVar5 = pbVar5 + 3;
      }
      else if (cVar2 == '\x05') {
        if ((long)fromLim - (long)pbVar5 < 2) goto LAB_0046369b;
        *puVar4 = pbVar5[1] & 0x3f | (uVar6 & 0x1f) << 6;
        puVar4 = puVar4 + 1;
        pbVar5 = pbVar5 + 2;
      }
      else {
        pbVar5 = pbVar5 + 1;
        *puVar4 = (short)(char)bVar1;
        puVar4 = puVar4 + 1;
      }
      bVar8 = pbVar5 < fromLim;
    } while ((bVar8) && (puVar4 < toLim));
  }
  if (bVar8) {
    XVar3 = XML_CONVERT_OUTPUT_EXHAUSTED;
  }
LAB_00463690:
  *fromP = (char *)pbVar5;
  *toP = puVar4;
  return XVar3;
}

Assistant:

static enum XML_Convert_Result PTRCALL
utf8_toUtf16(const ENCODING *enc,
             const char **fromP, const char *fromLim,
             unsigned short **toP, const unsigned short *toLim)
{
  enum XML_Convert_Result res = XML_CONVERT_COMPLETED;
  unsigned short *to = *toP;
  const char *from = *fromP;
  while (from < fromLim && to < toLim) {
    switch (((struct normal_encoding *)enc)->type[(unsigned char)*from]) {
    case BT_LEAD2:
      if (fromLim - from < 2) {
        res = XML_CONVERT_INPUT_INCOMPLETE;
        goto after;
      }
      *to++ = (unsigned short)(((from[0] & 0x1f) << 6) | (from[1] & 0x3f));
      from += 2;
      break;
    case BT_LEAD3:
      if (fromLim - from < 3) {
        res = XML_CONVERT_INPUT_INCOMPLETE;
        goto after;
      }
      *to++ = (unsigned short)(((from[0] & 0xf) << 12)
                               | ((from[1] & 0x3f) << 6) | (from[2] & 0x3f));
      from += 3;
      break;
    case BT_LEAD4:
      {
        unsigned long n;
        if (toLim - to < 2) {
          res = XML_CONVERT_OUTPUT_EXHAUSTED;
          goto after;
        }
        if (fromLim - from < 4) {
          res = XML_CONVERT_INPUT_INCOMPLETE;
          goto after;
        }
        n = ((from[0] & 0x7) << 18) | ((from[1] & 0x3f) << 12)
            | ((from[2] & 0x3f) << 6) | (from[3] & 0x3f);
        n -= 0x10000;
        to[0] = (unsigned short)((n >> 10) | 0xD800);
        to[1] = (unsigned short)((n & 0x3FF) | 0xDC00);
        to += 2;
        from += 4;
      }
      break;
    default:
      *to++ = *from++;
      break;
    }
  }
  if (from < fromLim)
    res = XML_CONVERT_OUTPUT_EXHAUSTED;
after:
  *fromP = from;
  *toP = to;
  return res;
}